

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

void destroyContextEGL(_GLFWwindow *window)

{
  long in_RDI;
  
  if ((*(int *)(in_RDI + 0x200) != 0x30001) && (*(long *)(in_RDI + 0x2a0) != 0)) {
    dlclose(*(undefined8 *)(in_RDI + 0x2a0));
    *(undefined8 *)(in_RDI + 0x2a0) = 0;
  }
  if (*(long *)(in_RDI + 0x298) != 0) {
    (*_glfw.egl.DestroySurface)(_glfw.egl.display,*(EGLSurface *)(in_RDI + 0x298));
    *(undefined8 *)(in_RDI + 0x298) = 0;
  }
  if (*(long *)(in_RDI + 0x290) != 0) {
    (*_glfw.egl.DestroyContext)(_glfw.egl.display,*(EGLContext *)(in_RDI + 0x290));
    *(undefined8 *)(in_RDI + 0x290) = 0;
  }
  return;
}

Assistant:

static void destroyContextEGL(_GLFWwindow* window)
{
#if defined(_GLFW_X11)
    // NOTE: Do not unload libGL.so.1 while the X11 display is still open,
    //       as it will make XCloseDisplay segfault
    if (window->context.client != GLFW_OPENGL_API)
#endif // _GLFW_X11
    {
        if (window->context.egl.client)
        {
            _glfw_dlclose(window->context.egl.client);
            window->context.egl.client = NULL;
        }
    }

    if (window->context.egl.surface)
    {
        eglDestroySurface(_glfw.egl.display, window->context.egl.surface);
        window->context.egl.surface = EGL_NO_SURFACE;
    }

    if (window->context.egl.handle)
    {
        eglDestroyContext(_glfw.egl.display, window->context.egl.handle);
        window->context.egl.handle = EGL_NO_CONTEXT;
    }
}